

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void iremga20_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  ga20_state *chip;
  
  uVar1 = *(uint *)((long)info + 0x10);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)info + 8)),data,__n);
  return;
}

Assistant:

static void iremga20_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	ga20_state *chip = (ga20_state *)info;
	
	if (offset > chip->rom_size)
		return;
	if (offset + length > chip->rom_size)
		length = chip->rom_size - offset;
	
	memcpy(chip->rom + offset, data, length);
	
	return;
}